

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::rejectEnter
          (SPxSolverBase<double> *this,SPxId enterId,double enterTest,Status enterStat)

{
  int iVar1;
  VectorBase<double> *pVVar2;
  DataKey local_20;
  
  local_20 = enterId.super_DataKey;
  iVar1 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_20);
  local_20.info = this->theRep * local_20.info;
  pVVar2 = &this->theCoTest;
  if (0 < local_20.info) {
    pVVar2 = &this->theTest;
  }
  (pVVar2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar1] = enterTest;
  (&(this->super_SPxBasisBase<double>).thedesc.stat)[local_20.info < 1]->data[iVar1] = enterStat;
  return;
}

Assistant:

void SPxSolverBase<R>::rejectEnter(
   SPxId enterId,
   R enterTest,
   typename SPxBasisBase<R>::Desc::Status enterStat
)
{
   int enterIdx = this->number(enterId);

   if(isId(enterId))
   {
      theTest[enterIdx] = enterTest;
      this->desc().status(enterIdx) = enterStat;
   }
   else
   {
      theCoTest[enterIdx] = enterTest;
      this->desc().coStatus(enterIdx) = enterStat;
   }
}